

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

idx_t duckdb::GetTypeIdSize(PhysicalType type)

{
  undefined4 uVar1;
  idx_t iVar2;
  InternalException *this;
  undefined7 in_register_00000039;
  string local_40;
  
  iVar2 = 1;
  uVar1 = (undefined4)CONCAT71(in_register_00000039,type);
  switch(uVar1) {
  case 1:
  case 2:
  case 3:
    break;
  case 4:
  case 5:
    iVar2 = 2;
    break;
  case 6:
  case 7:
  case 0xb:
    iVar2 = 4;
    break;
  case 8:
  case 9:
  case 0xc:
    iVar2 = 8;
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
switchD_0141de3a_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Invalid PhysicalType for GetTypeIdSize","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x15:
  case 0x17:
switchD_0141de3a_caseD_15:
    iVar2 = 0x10;
    break;
  case 0x18:
  case 0x1d:
switchD_0141de3a_caseD_18:
    iVar2 = 0;
    break;
  default:
    switch(uVar1) {
    case 200:
    case 0xcb:
    case 0xcc:
      goto switchD_0141de3a_caseD_15;
    default:
      goto switchD_0141de3a_caseD_a;
    case 0xcd:
      goto switchD_0141de3a_caseD_18;
    case 0xce:
      break;
    }
  }
  return iVar2;
}

Assistant:

idx_t GetTypeIdSize(PhysicalType type) {
	switch (type) {
	case PhysicalType::BIT:
	case PhysicalType::BOOL:
		return sizeof(bool);
	case PhysicalType::INT8:
		return sizeof(int8_t);
	case PhysicalType::INT16:
		return sizeof(int16_t);
	case PhysicalType::INT32:
		return sizeof(int32_t);
	case PhysicalType::INT64:
		return sizeof(int64_t);
	case PhysicalType::UINT8:
		return sizeof(uint8_t);
	case PhysicalType::UINT16:
		return sizeof(uint16_t);
	case PhysicalType::UINT32:
		return sizeof(uint32_t);
	case PhysicalType::UINT64:
		return sizeof(uint64_t);
	case PhysicalType::INT128:
		return sizeof(hugeint_t);
	case PhysicalType::UINT128:
		return sizeof(uhugeint_t);
	case PhysicalType::FLOAT:
		return sizeof(float);
	case PhysicalType::DOUBLE:
		return sizeof(double);
	case PhysicalType::VARCHAR:
		return sizeof(string_t);
	case PhysicalType::INTERVAL:
		return sizeof(interval_t);
	case PhysicalType::STRUCT:
	case PhysicalType::UNKNOWN:
	case PhysicalType::ARRAY:
		return 0; // no own payload
	case PhysicalType::LIST:
		return sizeof(list_entry_t); // offset + len
	default:
		throw InternalException("Invalid PhysicalType for GetTypeIdSize");
	}
}